

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fAtomicCounterTests.cpp
# Opt level: O0

bool deqp::gles31::Functional::anon_unknown_0::AtomicCounterTest::checkRange
               (TestLog *log,vector<unsigned_int,_std::allocator<unsigned_int>_> *values,
               vector<unsigned_int,_std::allocator<unsigned_int>_> *min,
               vector<unsigned_int,_std::allocator<unsigned_int>_> *max)

{
  value_type a;
  value_type mn;
  int iVar1;
  deBool dVar2;
  size_type sVar3;
  const_reference pvVar4;
  MessageBuilder *pMVar5;
  MessageBuilder local_340;
  MessageBuilder local_1b0;
  int local_30;
  int local_2c;
  int valueNdx;
  int failedCount;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *max_local;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *min_local;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *values_local;
  TestLog *log_local;
  
  local_2c = 0;
  _valueNdx = max;
  max_local = min;
  min_local = values;
  values_local = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)log;
  for (local_30 = 0; iVar1 = local_30,
      sVar3 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(min_local),
      iVar1 < (int)sVar3; local_30 = local_30 + 1) {
    pvVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                       (min_local,(long)local_30);
    if (*pvVar4 != 0xffffffff) {
      pvVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                         (min_local,(long)local_30);
      a = *pvVar4;
      pvVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                         (max_local,(long)local_30);
      mn = *pvVar4;
      pvVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                         (_valueNdx,(long)local_30);
      dVar2 = deInRange32(a,mn,*pvVar4);
      if (dVar2 == 0) {
        if (local_2c < 0x14) {
          tcu::TestLog::operator<<
                    (&local_1b0,(TestLog *)values_local,(BeginMessageToken *)&tcu::TestLog::Message)
          ;
          pMVar5 = tcu::MessageBuilder::operator<<(&local_1b0,(char (*) [7])"Value ");
          pvVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                             (min_local,(long)local_30);
          pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,pvVar4);
          pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(char (*) [16])" not in range [");
          pvVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                             (max_local,(long)local_30);
          pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,pvVar4);
          pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(char (*) [3])0xf95514);
          pvVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                             (_valueNdx,(long)local_30);
          pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,pvVar4);
          pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(char (*) [3])0xf2004e);
          tcu::MessageBuilder::operator<<(pMVar5,(EndMessageToken *)&tcu::TestLog::EndMessage);
          tcu::MessageBuilder::~MessageBuilder(&local_1b0);
        }
        local_2c = local_2c + 1;
      }
    }
  }
  if (0x14 < local_2c) {
    tcu::TestLog::operator<<
              (&local_340,(TestLog *)values_local,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar5 = tcu::MessageBuilder::operator<<
                       (&local_340,(char (*) [32])"Number of values not in range: ");
    pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,&local_2c);
    pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(char (*) [30])", displaying first 20 values.");
    tcu::MessageBuilder::operator<<(pMVar5,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_340);
  }
  return local_2c == 0;
}

Assistant:

bool AtomicCounterTest::checkRange (TestLog& log, const vector<deUint32>& values, const vector<deUint32>& min, const vector<deUint32>& max)
{
	int failedCount = 0;

	DE_ASSERT(values.size() == min.size());
	DE_ASSERT(values.size() == max.size());

	for (int valueNdx = 0; valueNdx < (int)values.size(); valueNdx++)
	{
		if (values[valueNdx] != (deUint32)-1)
		{
			if (!deInRange32(values[valueNdx], min[valueNdx], max[valueNdx]))
			{
				if (failedCount < 20)
					log << TestLog::Message << "Value " << values[valueNdx] << " not in range [" << min[valueNdx] << ", " << max[valueNdx] << "]." << TestLog::EndMessage;
				failedCount++;
			}
		}
	}

	if (failedCount > 20)
		log << TestLog::Message << "Number of values not in range: " << failedCount << ", displaying first 20 values." << TestLog::EndMessage;

	return failedCount == 0;
}